

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_statemach_act(connectdata *conn)

{
  ulong uVar1;
  anon_union_264_9_0449b319_for_proto *pp;
  uint *puVar2;
  curl_usessl cVar3;
  void *pvVar4;
  uint uVar5;
  _Bool _Var6;
  CURLcode CVar7;
  imapstate iVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  curl_socket_t sockfd;
  uint uVar13;
  char *pcVar14;
  SessionHandle *pSVar15;
  SessionHandle *pSVar16;
  char *chlg64_1;
  size_t len;
  size_t len_1;
  smtpstate state1;
  int smtpcode;
  size_t nread;
  char *local_78;
  char *local_70;
  char *local_68;
  smtpstate local_5c;
  ulong local_58;
  curl_socket_t local_50;
  uint local_4c;
  SessionHandle *local_48;
  void *local_40;
  size_t local_38;
  
  sockfd = conn->sock[0];
  pSVar16 = conn->data;
  local_38 = 0;
  if ((conn->proto).imapc.state == IMAP_AUTHENTICATE_PLAIN) {
LAB_00128a73:
    CVar7 = CURLE_NOT_BUILT_IN;
  }
  else {
    pp = &conn->proto;
    if ((conn->proto).ftpc.pp.sendleft != 0) {
      CVar7 = Curl_pp_flushsend(&(pp->ftpc).pp);
      return CVar7;
    }
    do {
      CVar7 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,(int *)&local_4c,&local_38);
      uVar5 = local_4c;
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      iVar8 = (conn->proto).imapc.state;
      if (local_4c != 1 && iVar8 != IMAP_APPEND_FINAL) {
        (pSVar16->info).httpcode = local_4c;
      }
      if (local_4c == 0) {
        return CURLE_OK;
      }
      switch(iVar8) {
      case IMAP_SERVERGREET:
        if (99 < local_4c - 200) {
          Curl_failf(conn->data,"Got unexpected smtp-server response: %d",(ulong)local_4c);
          return CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        (conn->proto).ftpc.dirdepth = 0;
        (conn->proto).imapc.cmdid = 0;
        (conn->proto).imapc.resptag[0] = '\0';
        (conn->proto).imapc.resptag[2] = '\0';
        CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"EHLO %s",(conn->proto).ftpc.dirs);
        iVar8 = IMAP_CAPABILITY;
        goto LAB_00128f2a;
      case IMAP_CAPABILITY:
        pSVar15 = conn->data;
        if (local_4c - 300 < 0xffffff9c && local_4c != 1) {
          if ((CURLUSESSL_TRY < (pSVar15->set).use_ssl) && (conn->ssl[0].use != true))
          goto LAB_0012965c;
          (conn->proto).imapc.cmdid = 0;
          CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"HELO %s",(conn->proto).ftpc.dirs);
          iVar8 = IMAP_STARTTLS;
          goto LAB_00128f2a;
        }
        sVar9 = strlen((pSVar15->state).buffer);
        uVar1 = sVar9 - 4;
        if (uVar1 < 8) {
          if (3 < uVar1) goto LAB_001291ec;
        }
        else if (*(long *)((pSVar15->state).buffer + 4) == 0x534c545452415453) {
          (conn->proto).imapc.resptag[0] = '\x01';
        }
        else {
LAB_001291ec:
          if (*(int *)((pSVar15->state).buffer + 4) == 0x455a4953) {
            (conn->proto).imapc.resptag[1] = '\x01';
          }
          else if ((4 < uVar1) &&
                  ((pSVar15->state).buffer[8] == ' ' &&
                   *(int *)((pSVar15->state).buffer + 4) == 0x48545541)) {
            (conn->proto).imapc.resptag[2] = '\x01';
            lVar10 = sVar9 - 9;
            if (lVar10 != 0) {
              pcVar14 = (pSVar15->state).buffer + 9;
LAB_00129240:
              do {
                if (((ulong)(byte)*pcVar14 < 0x21) &&
                   ((0x100002600U >> ((ulong)(byte)*pcVar14 & 0x3f) & 1) != 0))
                goto code_r0x0012924f;
                lVar11 = 0;
                do {
                  if (((ulong)(byte)pcVar14[lVar11] < 0x21) &&
                     (lVar12 = lVar11,
                     (0x100002600U >> ((ulong)(byte)pcVar14[lVar11] & 0x3f) & 1) != 0)) break;
                  lVar11 = lVar11 + 1;
                  lVar12 = lVar10;
                } while (lVar10 != lVar11);
                switch(lVar12) {
                case 4:
                  if (*(int *)pcVar14 == 0x4d4c544e) {
                    uVar13 = 0x40;
                    goto LAB_00129380;
                  }
                  break;
                case 5:
                  if (pcVar14[4] == 0x4e && *(int *)pcVar14 == 0x49474f4c) {
                    uVar13 = 1;
                  }
                  else {
                    if (pcVar14[4] != 0x4e || *(int *)pcVar14 != 0x49414c50) break;
                    uVar13 = 2;
                  }
                  goto LAB_00129380;
                case 6:
                  if (*(short *)(pcVar14 + 4) == 0x4950 && *(int *)pcVar14 == 0x41535347) {
                    uVar13 = 0x10;
                    goto LAB_00129380;
                  }
                  break;
                case 7:
                  if (*(int *)(pcVar14 + 3) == 0x32485455 && *(int *)pcVar14 == 0x55414f58) {
                    uVar13 = 0x80;
                    goto LAB_00129380;
                  }
                  break;
                case 8:
                  if (*(long *)pcVar14 == 0x35444d2d4d415243) {
                    uVar13 = 4;
                  }
                  else {
                    if (*(long *)pcVar14 != 0x4c414e5245545845) break;
                    uVar13 = 0x20;
                  }
LAB_00129380:
                  puVar2 = &(conn->proto).imapc.prefmech;
                  *puVar2 = *puVar2 | uVar13;
                  break;
                case 10:
                  if (*(short *)(pcVar14 + 8) == 0x3544 && *(long *)pcVar14 == 0x4d2d545345474944) {
                    uVar13 = 8;
                    goto LAB_00129380;
                  }
                }
                pcVar14 = pcVar14 + lVar12;
                lVar10 = lVar10 - lVar12;
              } while (lVar10 != 0);
            }
          }
        }
LAB_00129448:
        if (uVar5 != 1) {
          cVar3 = (pSVar15->set).use_ssl;
          if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
            if ((conn->proto).imapc.resptag[0] == '\x01') {
              CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","STARTTLS");
              iVar8 = IMAP_UPGRADETLS;
              goto LAB_00128f2a;
            }
            if (cVar3 != CURLUSESSL_TRY) {
              Curl_failf(pSVar15,"STARTTLS not supported.");
              return CURLE_USE_SSL_FAILED;
            }
          }
          CVar7 = smtp_perform_authentication(conn);
          break;
        }
        goto LAB_00129092;
      case IMAP_STARTTLS:
        if (99 < local_4c - 200) {
          pSVar15 = conn->data;
LAB_0012965c:
          Curl_failf(pSVar15,"Remote access denied: %d",(ulong)local_4c);
          return CURLE_REMOTE_ACCESS_DENIED;
        }
        goto switchD_00128b24_caseD_5;
      case IMAP_UPGRADETLS:
        if (local_4c == 0xdc) goto LAB_00128a73;
        if ((conn->data->set).use_ssl != CURLUSESSL_TRY) {
          Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)local_4c);
          return CURLE_USE_SSL_FAILED;
        }
        CVar7 = smtp_perform_authentication(conn);
        break;
      default:
        goto switchD_00128b24_caseD_5;
      case IMAP_AUTHENTICATE_LOGIN:
        pSVar15 = conn->data;
        local_70 = (char *)0x0;
        local_78 = (char *)0x0;
        if (local_4c == 0x14e) {
          CVar7 = Curl_sasl_create_plain_message
                            (pSVar15,conn->user,conn->passwd,&local_78,(size_t *)&local_70);
          goto LAB_00128f73;
        }
LAB_00128fb9:
        local_70 = (char *)0x0;
        local_78 = (char *)0x0;
        Curl_failf(pSVar15,"Access denied: %d",(ulong)local_4c);
        CVar7 = CURLE_LOGIN_DENIED;
        goto LAB_00128fe1;
      case IMAP_AUTHENTICATE_LOGIN_PASSWD:
        pSVar15 = conn->data;
        local_70 = (char *)0x0;
        local_78 = (char *)0x0;
        if (local_4c != 0x14e) goto LAB_00128fb9;
        CVar7 = Curl_sasl_create_login_message(pSVar15,conn->user,&local_78,(size_t *)&local_70);
        if ((local_78 == (char *)0x0 || CVar7 != CURLE_OK) ||
           (CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar7 != CURLE_OK)) goto LAB_00128fe1;
        (conn->proto).imapc.state = IMAP_AUTHENTICATE_CRAMMD5;
        goto LAB_00128fb4;
      case IMAP_AUTHENTICATE_CRAMMD5:
        pSVar15 = conn->data;
        local_70 = (char *)0x0;
        local_78 = (char *)0x0;
        if (local_4c != 0x14e) goto LAB_00128fb9;
        CVar7 = Curl_sasl_create_login_message(pSVar15,conn->passwd,&local_78,(size_t *)&local_70);
        goto LAB_00128f73;
      case IMAP_AUTHENTICATE_DIGESTMD5:
        pSVar15 = conn->data;
        local_70 = (char *)0x0;
        local_78 = (char *)0x0;
        local_68 = (char *)0x0;
        local_58 = 0;
        if (local_4c == 0x14e) {
          smtp_get_message((pSVar15->state).buffer,&local_78);
          CVar7 = Curl_sasl_decode_cram_md5_message(local_78,&local_70,&local_58);
          if (CVar7 == CURLE_OK) {
            CVar7 = Curl_sasl_create_cram_md5_message
                              (pSVar15,local_70,conn->user,conn->passwd,&local_68,&local_58);
            if ((local_68 != (char *)0x0 && CVar7 == CURLE_OK) &&
               (CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar7 == CURLE_OK)) {
              iVar8 = IMAP_LOGIN;
              goto LAB_001294cc;
            }
          }
          else {
            CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","*");
            if (CVar7 == CURLE_OK) {
              iVar8 = IMAP_AUTHENTICATE_FINAL;
LAB_001294cc:
              (conn->proto).imapc.state = iVar8;
              CVar7 = CURLE_OK;
            }
          }
          pcVar14 = local_68;
          if (local_70 != (char *)0x0) {
            (*Curl_cfree)(local_70);
            local_70 = (char *)0x0;
            pcVar14 = local_68;
          }
          goto LAB_001294f6;
        }
LAB_00128e4f:
        local_68 = (char *)0x0;
        local_70 = (char *)0x0;
        local_78 = (char *)0x0;
        Curl_failf(pSVar15,"Access denied: %d",(ulong)local_4c);
        CVar7 = CURLE_LOGIN_DENIED;
        break;
      case IMAP_AUTHENTICATE_DIGESTMD5_RESP:
        pSVar15 = conn->data;
        local_70 = (char *)0x0;
        local_78 = (char *)0x0;
        local_68 = (char *)0x0;
        if (local_4c != 0x14e) goto LAB_00128e4f;
        smtp_get_message((pSVar15->state).buffer,&local_70);
        CVar7 = Curl_sasl_create_digest_md5_message
                          (pSVar15,local_70,conn->user,conn->passwd,"smtp",&local_78,
                           (size_t *)&local_68);
        if (CVar7 == CURLE_OK) {
          CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s",local_78);
          pcVar14 = local_78;
          if (CVar7 == CURLE_OK) {
            iVar8 = IMAP_AUTHENTICATE_NTLM;
            goto LAB_0012949e;
          }
        }
        else {
          pcVar14 = local_78;
          if ((CVar7 == CURLE_BAD_CONTENT_ENCODING) &&
             (CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","*"), pcVar14 = local_78, CVar7 == CURLE_OK)
             ) {
            iVar8 = IMAP_AUTHENTICATE_FINAL;
LAB_0012949e:
            (conn->proto).imapc.state = iVar8;
            CVar7 = CURLE_OK;
            pcVar14 = local_78;
          }
        }
LAB_001294f6:
        if (pcVar14 == (char *)0x0) break;
        goto LAB_00128fed;
      case IMAP_AUTHENTICATE_NTLM:
        if (local_4c != 0x14e) {
LAB_00129537:
          Curl_failf(conn->data,"Authentication failed: %d",(ulong)local_4c);
          return CURLE_LOGIN_DENIED;
        }
        CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","");
        iVar8 = IMAP_LOGIN;
        goto LAB_00128f2a;
      case IMAP_AUTHENTICATE_CANCEL:
        pSVar15 = conn->data;
        local_70 = (char *)0x0;
        local_78 = (char *)0x0;
        if (local_4c != 0x14e) goto LAB_00128fb9;
        CVar7 = Curl_sasl_create_xoauth2_message
                          (pSVar15,conn->user,conn->xoauth2_bearer,&local_78,(size_t *)&local_70);
LAB_00128f73:
        if ((local_78 != (char *)0x0 && CVar7 == CURLE_OK) &&
           (CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar7 == CURLE_OK)) {
          (conn->proto).imapc.state = IMAP_LOGIN;
LAB_00128fb4:
          CVar7 = CURLE_OK;
        }
LAB_00128fe1:
        pcVar14 = local_78;
        if (local_78 != (char *)0x0) {
LAB_00128fed:
          (*Curl_cfree)(pcVar14);
        }
        break;
      case IMAP_AUTHENTICATE_FINAL:
        pSVar15 = conn->data;
        local_70 = (char *)0x0;
        local_78 = (char *)0x0;
        local_68 = (char *)0x0;
        local_58 = local_58 & 0xffffffff00000000;
        local_5c = SMTP_STOP;
        puVar2 = &(conn->proto).imapc.prefmech;
        *puVar2 = *puVar2 ^ (conn->proto).pop3c.authtypes;
        CVar7 = smtp_calc_sasl_details
                          (conn,&local_70,&local_78,(size_t *)&local_68,(smtpstate *)&local_58,
                           &local_5c);
        if (CVar7 == CURLE_OK) {
          if (local_70 == (char *)0x0) {
            Curl_failf(pSVar15,"Authentication cancelled");
            CVar7 = CURLE_LOGIN_DENIED;
          }
          else {
            CVar7 = smtp_perform_auth(conn,local_70,local_78,(size_t)local_68,(smtpstate)local_58,
                                      local_5c);
            if (local_78 != (char *)0x0) {
              (*Curl_cfree)(local_78);
            }
          }
        }
        break;
      case IMAP_LOGIN:
        if (local_4c != 0xeb) goto LAB_00129537;
        goto switchD_00128b24_caseD_5;
      case IMAP_LIST:
        pSVar15 = conn->data;
        pvVar4 = (pSVar15->req).protop;
        pcVar14 = (pSVar15->state).buffer;
        local_50 = sockfd;
        local_48 = pSVar16;
        sVar9 = strlen(pcVar14);
        local_40 = pvVar4;
        if ((uVar5 - 300 < 0xffffff9c) && (*(long *)((long)pvVar4 + 0x10) != 0)) {
          if ((uVar5 != 1) && (uVar5 != 0x229)) {
LAB_0012960b:
            Curl_failf(pSVar15,"Command failed: %d",(ulong)uVar5);
            return CURLE_RECV_ERROR;
          }
        }
        else if ((uVar5 - 300 < 0xffffff9c) &&
                ((uVar5 != 1 && (*(long *)((long)pvVar4 + 0x10) == 0)))) goto LAB_0012960b;
        CVar7 = CURLE_OK;
        if ((pSVar15->set).opt_no_body == false) {
          pcVar14[sVar9] = '\n';
          CVar7 = Curl_client_write(conn,1,pcVar14,sVar9 + 1);
          pcVar14[sVar9] = '\0';
        }
        pSVar16 = local_48;
        sockfd = local_50;
        if (uVar5 != 1) {
          if ((*(long *)((long)local_40 + 0x10) == 0) ||
             (lVar10 = *(long *)(*(long *)((long)local_40 + 0x10) + 8),
             *(long *)((long)local_40 + 0x10) = lVar10, lVar10 == 0)) {
            (conn->proto).imapc.state = IMAP_STOP;
          }
          else {
            CVar7 = smtp_perform_command(conn);
          }
        }
        break;
      case IMAP_SELECT:
        if (99 < local_4c - 200) {
          pSVar15 = conn->data;
          pcVar14 = "MAIL failed: %d";
LAB_00129631:
          Curl_failf(pSVar15,pcVar14,(ulong)local_4c);
          return CURLE_SEND_ERROR;
        }
LAB_0012906c:
        CVar7 = smtp_perform_rcpt_to(conn);
        break;
      case IMAP_FETCH:
        pSVar15 = conn->data;
        if (99 < local_4c - 200) {
          pcVar14 = "RCPT failed: %d";
          goto LAB_00129631;
        }
        pvVar4 = (pSVar15->req).protop;
        lVar10 = *(long *)(*(long *)((long)pvVar4 + 0x10) + 8);
        *(long *)((long)pvVar4 + 0x10) = lVar10;
        if (lVar10 != 0) goto LAB_0012906c;
        CVar7 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","DATA");
        iVar8 = IMAP_FETCH_FINAL;
LAB_00128f2a:
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
        (conn->proto).imapc.state = iVar8;
        goto LAB_00129092;
      case IMAP_FETCH_FINAL:
        pSVar15 = conn->data;
        if (local_4c != 0x162) {
          pcVar14 = "DATA failed: %d";
          goto LAB_00129631;
        }
        Curl_pgrsSetUploadSize(pSVar15,(pSVar15->state).infilesize);
        Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
switchD_00128b24_caseD_5:
        (conn->proto).imapc.state = IMAP_STOP;
        return CURLE_OK;
      case IMAP_APPEND:
        (conn->proto).imapc.state = IMAP_STOP;
        if (local_4c == 0xfa) {
          return CURLE_OK;
        }
        return CURLE_RECV_ERROR;
      }
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      if ((conn->proto).imapc.state == IMAP_STOP) {
        return CURLE_OK;
      }
LAB_00129092:
      _Var6 = Curl_pp_moredata(&(pp->ftpc).pp);
      CVar7 = CURLE_OK;
    } while (_Var6);
  }
  return CVar7;
code_r0x0012924f:
  pcVar14 = pcVar14 + 1;
  lVar10 = lVar10 + -1;
  if (lVar10 == 0) goto LAB_00129448;
  goto LAB_00129240;
}

Assistant:

static CURLcode smtp_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct SessionHandle *data = conn->data;
  int smtpcode;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not SMTP */
  if(smtpc->state == SMTP_UPGRADETLS)
    return smtp_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &smtpcode, &nread);
    if(result)
      return result;

    /* Store the latest response for later retrieval if necessary */
    if(smtpc->state != SMTP_QUIT && smtpcode != 1)
      data->info.httpcode = smtpcode;

    if(!smtpcode)
      break;

    /* We have now received a full SMTP server response */
    switch(smtpc->state) {
    case SMTP_SERVERGREET:
      result = smtp_state_servergreet_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_EHLO:
      result = smtp_state_ehlo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_HELO:
      result = smtp_state_helo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_STARTTLS:
      result = smtp_state_starttls_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_PLAIN:
      result = smtp_state_auth_plain_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_LOGIN:
      result = smtp_state_auth_login_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_LOGIN_PASSWD:
      result = smtp_state_auth_login_password_resp(conn, smtpcode,
                                                   smtpc->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case SMTP_AUTH_CRAMMD5:
      result = smtp_state_auth_cram_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_DIGESTMD5:
      result = smtp_state_auth_digest_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_DIGESTMD5_RESP:
      result = smtp_state_auth_digest_resp_resp(conn, smtpcode, smtpc->state);
      break;
#endif

#ifdef USE_NTLM
    case SMTP_AUTH_NTLM:
      result = smtp_state_auth_ntlm_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_NTLM_TYPE2MSG:
      result = smtp_state_auth_ntlm_type2msg_resp(conn, smtpcode,
                                                  smtpc->state);
      break;
#endif

#if defined(USE_WINDOWS_SSPI)
    case SMTP_AUTH_GSSAPI:
      result = smtp_state_auth_gssapi_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_GSSAPI_TOKEN:
      result = smtp_state_auth_gssapi_token_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_GSSAPI_NO_DATA:
      result = smtp_state_auth_gssapi_no_data_resp(conn, smtpcode,
                                                   smtpc->state);
      break;
#endif

    case SMTP_AUTH_XOAUTH2:
      result = smtp_state_auth_xoauth2_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_CANCEL:
      result = smtp_state_auth_cancel_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH_FINAL:
      result = smtp_state_auth_final_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_COMMAND:
      result = smtp_state_command_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_MAIL:
      result = smtp_state_mail_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_RCPT:
      result = smtp_state_rcpt_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_DATA:
      result = smtp_state_data_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_POSTDATA:
      result = smtp_state_postdata_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, SMTP_STOP);
      break;
    }
  } while(!result && smtpc->state != SMTP_STOP && Curl_pp_moredata(pp));

  return result;
}